

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zvgBan.c
# Opt level: O0

void zvgBanner(uint *speeds,ZvgID_s *id)

{
  uint uVar1;
  FILE *pFVar2;
  char *pcVar3;
  uint local_20;
  uint monSpeed;
  uint monFlags;
  uint port;
  ZvgID_s *id_local;
  uint *speeds_local;
  
  _monFlags = id;
  id_local = (ZvgID_s *)speeds;
  zvgGetPortInfo(&monSpeed,&local_20);
  uVar1 = *(uint *)(id_local->mfg + (ulong)(_monFlags->sws >> 4 & 3) * 4);
  fprintf(_stdout,"\nZVG found on PORT=%03X, ",(ulong)monSpeed);
  fputs("\n\nFirmware Version:",_stdout);
  pFVar2 = _stdout;
  pcVar3 = sVer(_monFlags->fVer);
  fprintf(pFVar2,"\n   Controller:   %s",pcVar3);
  pFVar2 = _stdout;
  pcVar3 = sVer(_monFlags->bVer);
  fprintf(pFVar2,"\n   Bootloader:   %s",pcVar3);
  pFVar2 = _stdout;
  pcVar3 = sVer(_monFlags->vVer);
  fprintf(pFVar2,"\n   Vector Timer: %s",pcVar3);
  fprintf(_stdout,"\n\nMonitor Settings (%u): ",(ulong)local_20);
  fputs("\n   Type:           ",_stdout);
  if ((local_20 & 8) == 0) {
    fputs("Color",_stdout);
  }
  else {
    fputs("B&W",_stdout);
  }
  fputs("\n   Spotkill Logic: ",_stdout);
  if ((local_20 & 4) == 0) {
    fputs("Disabled",_stdout);
  }
  else {
    fputs("Enabled",_stdout);
  }
  fputs("\n   Orientation:    ",_stdout);
  if (((local_20 & 1) == 0) || ((local_20 & 2) == 0)) {
    if ((local_20 & 1) == 0) {
      if ((local_20 & 2) == 0) {
        fputs("Do not flip X or Y axes",_stdout);
      }
      else {
        fputs("Flip Y axis",_stdout);
      }
    }
    else {
      fputs("Flip X axis",_stdout);
    }
  }
  else {
    fputs("Flip X and Y axes",_stdout);
  }
  fputs("\n   Overscan:       ",_stdout);
  if ((local_20 & 0x10) == 0) {
    fputs("Overscanning allowed",_stdout);
  }
  else {
    fputs("Do not overscan monitor",_stdout);
  }
  fprintf(_stdout,"\n   Speed:          %uus per inch",(ulong)uVar1);
  fflush(_stdout);
  return;
}

Assistant:

void zvgBanner( ZvgSpeeds_a speeds, ZvgID_s *id)
{
	uint	port, monFlags;
	//uint	dma, dmaMode, irq;
	uint	monSpeed;

	// get port stuff

	zvgGetPortInfo( &port, &monFlags);

	// lookup monitor speed in speed table based on switch settings

	monSpeed = speeds[(id->sws >> 4) & 0x03];

	// print banner

	fprintf( stdout, "\nZVG found on PORT=%03X, ", port);

	//if (dmaMode != 0)
	//	fprintf( stdout, "DMA=%u, DMA Mode=%u, IRQ=%u.", dma, dmaMode, irq);

	//else
	//	fputs( "Using polled mode (DMA disabled).", stdout);

	fputs( "\n\nFirmware Version:", stdout);

	fprintf( stdout, "\n   Controller:   %s", sVer( id->fVer));
	fprintf( stdout, "\n   Bootloader:   %s", sVer( id->bVer));
	fprintf( stdout, "\n   Vector Timer: %s", sVer( id->vVer));

	fprintf( stdout, "\n\nMonitor Settings (%u): ", monFlags);
	fputs( "\n   Type:           ", stdout);

	if (monFlags & MONF_BW)
		fputs( "B&W", stdout);

	else
		fputs( "Color", stdout);

	fputs( "\n   Spotkill Logic: ", stdout);

	if (monFlags & MONF_SPOTKILL)
		fputs( "Enabled", stdout);

	else
		fputs( "Disabled", stdout);

	fputs( "\n   Orientation:    ", stdout);

	if ((monFlags & MONF_FLIPX) && (monFlags & MONF_FLIPY))
		fputs( "Flip X and Y axes", stdout);

	else if (monFlags & MONF_FLIPX)
		fputs( "Flip X axis", stdout);

	else if (monFlags & MONF_FLIPY)
		fputs( "Flip Y axis", stdout);

	else
		fputs( "Do not flip X or Y axes", stdout);

	fputs( "\n   Overscan:       ", stdout);

	if (monFlags & MONF_NOOVS)
		fputs( "Do not overscan monitor", stdout);

	else
		fputs( "Overscanning allowed", stdout);

	fprintf( stdout, "\n   Speed:          %uus per inch", monSpeed);

	fflush( stdout);
}